

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O0

void __thiscall
IlmThread_3_4::anon_unknown_5::DefaultThreadPoolProvider::addTask
          (DefaultThreadPoolProvider *this,Task *task)

{
  mutex_type *in_RDI;
  Semaphore *unaff_retaddr;
  lock_guard<std::mutex> taskLock;
  lock_guard<std::mutex> *this_00;
  value_type *in_stack_ffffffffffffffd8;
  vector<IlmThread_3_4::Task_*,_std::allocator<IlmThread_3_4::Task_*>_> *in_stack_ffffffffffffffe0;
  
  this_00 = (lock_guard<std::mutex> *)((long)&(in_RDI->super___mutex_base)._M_mutex + 8);
  std::
  __shared_ptr_access<IlmThread_3_4::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<IlmThread_3_4::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x108da5);
  std::lock_guard<std::mutex>::lock_guard(this_00,in_RDI);
  std::
  __shared_ptr_access<IlmThread_3_4::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<IlmThread_3_4::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x108dc0);
  std::vector<IlmThread_3_4::Task_*,_std::allocator<IlmThread_3_4::Task_*>_>::push_back
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x108ddd);
  std::
  __shared_ptr_access<IlmThread_3_4::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<IlmThread_3_4::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x108dea);
  Semaphore::post(unaff_retaddr);
  return;
}

Assistant:

void
DefaultThreadPoolProvider::addTask (Task* task)
{
    // the thread pool will kill us and switch to a null provider
    // if the thread count is set to 0, so we can always
    // go ahead and lock and assume we have a thread to do the
    // processing
    {
        std::lock_guard<std::mutex> taskLock (_data->_taskMutex);

        //
        // Push the new task into the FIFO
        //
        _data->_tasks.push_back (task);
    }

    //
    // Signal that we have a new task to process
    //
    _data->_taskSemaphore.post ();
}